

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

int divide_look_behind_alternatives(Node *node)

{
  Bits BVar1;
  Node *b;
  int iVar2;
  _Node *p_Var3;
  Node *insert_node;
  _Node *local_30;
  
  BVar1 = (node->u).cclass.bs[1];
  b = (node->u).base.body;
  p_Var3 = (b->u).base.body;
  node_swap(node,b);
  (node->u).base.body = b;
  (b->u).base.body = p_Var3;
  p_Var3 = (node->u).cons.cdr;
  if (p_Var3 != (_Node *)0x0) {
    do {
      iVar2 = onig_node_copy(&local_30,b);
      if (iVar2 != 0) {
        return iVar2;
      }
      if (local_30 == (_Node *)0x0) {
        return -5;
      }
      (local_30->u).base.body = (p_Var3->u).base.body;
      (p_Var3->u).base.body = local_30;
      p_Var3 = (p_Var3->u).cons.cdr;
    } while (p_Var3 != (_Node *)0x0);
  }
  if (BVar1 == 8) {
    do {
      (node->u).base.node_type = ND_LIST;
      node = (node->u).cons.cdr;
    } while (node != (_Node *)0x0);
  }
  return 0;
}

Assistant:

static int
divide_look_behind_alternatives(Node* node)
{
  int r;
  int anc_type;
  Node *head, *np, *insert_node;
  AnchorNode* an;

  an = ANCHOR_(node);
  anc_type = an->type;

  head = ND_ANCHOR_BODY(an);
  np = ND_CAR(head);
  node_swap(node, head);
  ND_CAR(node) = head;
  ND_BODY(head) = np;

  np = node;
  while (IS_NOT_NULL(np = ND_CDR(np))) {
    r = onig_node_copy(&insert_node, head);
    if (r != 0) return r;
    CHECK_NULL_RETURN_MEMERR(insert_node);
    ND_BODY(insert_node) = ND_CAR(np);
    ND_CAR(np) = insert_node;
  }

  if (anc_type == ANCR_LOOK_BEHIND_NOT) {
    np = node;
    do {
      ND_SET_TYPE(np, ND_LIST);  /* alt -> list */
    } while (IS_NOT_NULL(np = ND_CDR(np)));
  }
  return 0;
}